

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

DirPathPair * __thiscall
capnp::compiler::CompilerMain::interpretSourceFile
          (DirPathPair *__return_storage_ptr__,CompilerMain *this,StringPtr pathStr)

{
  OutputDirective *pOVar1;
  ProcessContext *pPVar2;
  PathPtr prefix;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *params_1;
  size_t extraout_RDX;
  void *__child_stack;
  ArrayPtr<const_char> *extraout_RDX_00;
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> *extraout_RDX_01;
  size_t sVar5;
  long lVar6;
  long lVar7;
  void *in_R8;
  long lVar8;
  OutputDirective *this_00;
  Fault f;
  Path path;
  DebugComparison<unsigned_long,_int> _kjCondition;
  StringPtr local_60;
  PathPtr cwd;
  StringPtr pathStr_local;
  
  pathStr_local.content.size_ = pathStr.content.size_;
  pathStr_local.content.ptr = pathStr.content.ptr;
  iVar4 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  cwd.parts.ptr = (String *)CONCAT44(extraout_var,iVar4);
  cwd.parts.size_ = extraout_RDX;
  kj::PathPtr::eval(&path,&cwd,pathStr);
  _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
  _kjCondition.left = path.parts.size_;
  params_1 = " > ";
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = path.parts.size_ != 0;
  if (path.parts.size_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x7bb,FAILED,"path.size() > 0","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  lVar8 = -path.parts.size_;
  lVar7 = path.parts.size_ * 0x18;
  sVar5 = path.parts.size_;
  do {
    lVar8 = lVar8 + 1;
    sVar5 = sVar5 - 1;
    lVar6 = lVar7 + -0x18;
    if (lVar8 == 0) {
      prefix.parts.size_ = cwd.parts.size_;
      prefix.parts.ptr = cwd.parts.ptr;
      bVar3 = kj::Path::startsWith(&path,prefix);
      if (bVar3) {
        iVar4 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
        __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar4);
        _kjCondition.left = (unsigned_long)(path.parts.ptr + cwd.parts.size_);
        _kjCondition._8_8_ = path.parts.size_ - cwd.parts.size_;
        kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)&_kjCondition,
                           (void *)_kjCondition.left,(int)_kjCondition._8_8_,in_R8);
        goto LAB_00119bbe;
      }
      this_00 = (this->outputs).builder.ptr;
      pOVar1 = (this->outputs).builder.pos;
      params = extraout_RDX_00;
      goto LAB_00119ac0;
    }
    _kjCondition.left = (unsigned_long)path.parts.ptr;
    f.exception = (Exception *)((long)&path.parts.ptr[-1].content.ptr + lVar7);
    params_1 = (char *)(path.parts.size_ + lVar8);
    _kjCondition._8_8_ = sVar5;
    kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::find<kj::PathPtr&>
              ((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory> *)&local_60,
               (PathPtr *)&this->sourceDirectories);
    lVar7 = lVar6;
  } while ((local_60.content.ptr == (char *)0x0) || (local_60.content.ptr[0x10] != '\x01'));
  __return_storage_ptr__->dir = *(ReadableDirectory **)(local_60.content.ptr + 8);
  kj::PathPtr::clone((PathPtr *)&__return_storage_ptr__->path,(__fn *)&f,__child_stack,(int)params_1
                     ,in_R8);
LAB_00119bbe:
  kj::Array<kj::String>::~Array(&path.parts);
  return __return_storage_ptr__;
LAB_00119ac0:
  if (this_00 == pOVar1) goto LAB_00119b85;
  kj::str<kj::ArrayPtr<char_const>&>((String *)&_kjCondition,(kj *)this_00,params);
  f.exception = (Exception *)0x20ae24;
  bVar3 = kj::String::operator==((String *)&_kjCondition,(StringPtr *)&f);
  if (!bVar3) {
    local_60.content.ptr = "capnp";
    local_60.content.size_ = 6;
    bVar3 = kj::String::operator==((String *)&_kjCondition,&local_60);
    if (!bVar3) {
      pPVar2 = this->context;
      kj::str<kj::StringPtr&,char_const(&)[197]>
                ((String *)&f,(kj *)&pathStr_local,
                 (StringPtr *)
                 ": File is not in the current directory and does not match any prefix defined with --src-prefix. Please pass an appropriate --src-prefix so I can figure out where to write the output for this file."
                 ,(char (*) [197])params_1);
      (*pPVar2->_vptr_ProcessContext[2])(pPVar2,f.exception,2);
      kj::Array<char>::~Array((Array<char> *)&f);
      kj::Array<char>::~Array((Array<char> *)&_kjCondition);
      goto LAB_00119b85;
    }
  }
  kj::Array<char>::~Array((Array<char> *)&_kjCondition);
  this_00 = this_00 + 1;
  params = extraout_RDX_01;
  goto LAB_00119ac0;
LAB_00119b85:
  iVar4 = (**((this->disk).ptr)->_vptr_Filesystem)();
  __return_storage_ptr__->dir = (ReadableDirectory *)CONCAT44(extraout_var_01,iVar4);
  (__return_storage_ptr__->path).parts.ptr = path.parts.ptr;
  (__return_storage_ptr__->path).parts.size_ = path.parts.size_;
  (__return_storage_ptr__->path).parts.disposer = path.parts.disposer;
  path.parts.ptr = (String *)0x0;
  path.parts.size_ = 0;
  goto LAB_00119bbe;
}

Assistant:

DirPathPair interpretSourceFile(kj::StringPtr pathStr) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    KJ_REQUIRE(path.size() > 0);
    for (size_t i = path.size() - 1; i > 0; i--) {
      auto prefix = path.slice(0, i);
      auto remainder = path.slice(i, path.size());

      KJ_IF_SOME(sdir, sourceDirectories.find(prefix)) {
        if (sdir.isSourcePrefix) {
          return { *sdir.dir, remainder.clone() };
        }
      }
    }

    // No source prefix matched. Fall back to heuristic: try stripping the current directory,
    // otherwise don't strip anything.
    if (path.startsWith(cwd)) {
      return { disk->getCurrent(), path.slice(cwd.size(), path.size()).clone() };
    } else {
      // Hmm, no src-prefix matched and the file isn't even in the current directory. This might
      // be OK if we aren't generating any output anyway, but otherwise the results will almost
      // certainly not be what the user wanted. Let's print a warning, unless the output directives
      // are ones which we know do not produce output files. This is a hack.
      for (auto& output: outputs) {
        auto name = kj::str(output.name);
        if (name != "-" && name != "capnp") {
          context.warning(kj::str(pathStr,
              ": File is not in the current directory and does not match any prefix defined with "
              "--src-prefix. Please pass an appropriate --src-prefix so I can figure out where to "
              "write the output for this file."));
          break;
        }
      }

      return { disk->getRoot(), kj::mv(path) };
    }
  }